

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::IsWithinBounds
          (LoopDependenceAnalysis *this,int64_t value,int64_t bound_one,int64_t bound_two)

{
  if (bound_one < bound_two) {
    return value <= bound_two && bound_one <= value;
  }
  if (bound_two < bound_one) {
    return value <= bound_one && bound_two <= value;
  }
  return value == bound_one;
}

Assistant:

bool LoopDependenceAnalysis::IsWithinBounds(int64_t value, int64_t bound_one,
                                            int64_t bound_two) {
  if (bound_one < bound_two) {
    // If |bound_one| is the lower bound.
    return (value >= bound_one && value <= bound_two);
  } else if (bound_one > bound_two) {
    // If |bound_two| is the lower bound.
    return (value >= bound_two && value <= bound_one);
  } else {
    // Both bounds have the same value.
    return value == bound_one;
  }
}